

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

trie trie_create_reserve(size_t capacity,size_t key_limit,size_t depth_limit,trie_cb_hash hash_cb,
                        trie_cb_compare compare_cb)

{
  trie __ptr;
  size_t sVar1;
  trie_node __s;
  undefined8 uVar2;
  char *pcVar3;
  
  if (hash_cb == (trie_cb_hash)0x0 && compare_cb == (trie_cb_compare)0x0) {
    pcVar3 = "Trie invalid callback";
    uVar2 = 0x96;
  }
  else {
    __ptr = (trie)malloc(0x48);
    if (__ptr != (trie)0x0) {
      sVar1 = 0x10;
      if (0x10 < capacity) {
        sVar1 = capacity;
      }
      __ptr->size = 1;
      __ptr->capacity = sVar1;
      __ptr->key_limit = key_limit;
      __ptr->depth_limit = depth_limit;
      __ptr->hash_cb = hash_cb;
      __ptr->compare_cb = compare_cb;
      __s = (trie_node)malloc(sVar1 * 0x28);
      __ptr->node_list = __s;
      if (__s != (trie_node)0x0) {
        memset(__s,0,sVar1 * 0x28);
        __ptr->root = __s;
        __ptr->free_node_list = (trie_node_free_conflict)0x0;
        return __ptr;
      }
      log_write_impl_va("metacall",0xaf,"trie_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,3,"Trie bad node list creation");
      free(__ptr);
      return (trie)0x0;
    }
    pcVar3 = "Trie bad allocation";
    uVar2 = 0x9f;
  }
  log_write_impl_va("metacall",uVar2,"trie_create_reserve",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                    ,3,pcVar3);
  return (trie)0x0;
}

Assistant:

trie trie_create_reserve(size_t capacity, size_t key_limit, size_t depth_limit, trie_cb_hash hash_cb, trie_cb_compare compare_cb)
{
	trie t;

	size_t iterator;

	if (hash_cb == NULL && compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid callback");

		return NULL;
	}

	t = malloc(sizeof(struct trie_type));

	if (t == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad allocation");

		return NULL;
	}

	t->size = 1;
	t->capacity = (capacity < TRIE_CAPACITY_MIN) ? TRIE_CAPACITY_MIN : capacity;
	t->key_limit = key_limit;
	t->depth_limit = depth_limit;
	t->hash_cb = hash_cb;
	t->compare_cb = compare_cb;

	t->node_list = malloc(t->capacity * sizeof(struct trie_node_type));

	if (t->node_list == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list creation");

		free(t);

		return NULL;
	}

	for (iterator = 0; iterator < t->capacity; ++iterator)
	{
		trie_node n = &t->node_list[iterator];

		n->parent_index = 0;
		n->self_index = 0;
		n->key = NULL;
		n->value = NULL;
		n->childs = NULL;
	}

	t->root = &t->node_list[0];

	t->free_node_list = NULL;

	return t;
}